

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ConstraintsBiLoad_Ct(ChLinkLock *this,double factor)

{
  ChLinkMaskLF *this_00;
  double dVar1;
  undefined1 auVar2 [16];
  ChConstraintTwoBodies *pCVar3;
  ChConstraintTwoBodies *pCVar4;
  Scalar *pSVar5;
  int i;
  int i_00;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this_00 = &this->mask;
  iVar6 = 0;
  for (i_00 = 0; i_00 < (this->mask).super_ChLinkMask.nconstr; i_00 = i_00 + 1) {
    pCVar3 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,i_00);
    if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar3 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,i_00);
      pCVar4 = ChLinkMask::Constr_N(&this_00->super_ChLinkMask,i_00);
      dVar1 = (pCVar4->super_ChConstraintTwo).super_ChConstraint.b_i;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)&this->Ct,
                          (long)iVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = factor;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar1;
      iVar6 = iVar6 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pSVar5;
      auVar2 = vfmadd231sd_fma(auVar8,auVar7,auVar2);
      (pCVar3->super_ChConstraintTwo).super_ChConstraint.b_i = auVar2._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsBiLoad_Ct(double factor) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            mask.Constr_N(i).Set_b_i(mask.Constr_N(i).Get_b_i() + factor * Ct(cnt));
            cnt++;
        }
    }
}